

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::link_domchgs(HighsNodeQueue *this,int64_t node)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  size_type in_RSI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_bool> pVar5;
  HighsInt col;
  double val;
  HighsInt i;
  HighsInt numchgs;
  vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *this_00;
  _Rb_tree_const_iterator<std::pair<double,_long>_> in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  int local_18;
  
  pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
           operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *
                      )(in_RDI + 1),in_RSI);
  sVar2 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                    (&pvVar1->domchgstack);
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::operator[]
            ((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *)
             (in_RDI + 1),in_RSI);
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::resize((vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
            *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
           (size_type)in_stack_ffffffffffffff98._M_node);
  for (local_18 = 0; local_18 != (int)sVar2; local_18 = local_18 + 1) {
    this_00 = (vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *)
              (in_RDI + 1);
    pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[](this_00,in_RSI);
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              (&pvVar1->domchgstack,(long)local_18);
    pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[](this_00,in_RSI);
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              (&pvVar1->domchgstack,(long)local_18);
    pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[](this_00,in_RSI);
    pvVar3 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&pvVar1->domchgstack,(long)local_18);
    if (pvVar3->boundtype == kLower) {
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::get((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
             *)this_00);
      pVar5 = std::
              set<std::pair<double,long>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
              ::emplace<double&,long&>
                        ((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                          *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                         (double *)in_stack_ffffffffffffff98._M_node,in_RDI);
      pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
               operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                           *)(in_RDI + 1),in_RSI);
      pvVar4 = std::
               vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
               ::operator[](&pvVar1->domchglinks,(long)local_18);
      pvVar4->_M_node = pVar5.first._M_node._M_node;
    }
    else if (pvVar3->boundtype == kUpper) {
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::get((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
             *)this_00);
      pVar5 = std::
              set<std::pair<double,long>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
              ::emplace<double&,long&>
                        ((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                          *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                         (double *)in_stack_ffffffffffffff98._M_node,in_RDI);
      in_stack_ffffffffffffffa0 = pVar5.second;
      in_stack_ffffffffffffff98._M_node = pVar5.first._M_node._M_node;
      pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
               operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                           *)(in_RDI + 1),in_RSI);
      pvVar4 = std::
               vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
               ::operator[](&pvVar1->domchglinks,(long)local_18);
      pvVar4->_M_node = pVar5.first._M_node._M_node;
    }
  }
  return;
}

Assistant:

void HighsNodeQueue::link_domchgs(int64_t node) {
  assert(node != -1);
  HighsInt numchgs = nodes[node].domchgstack.size();
  nodes[node].domchglinks.resize(numchgs);

  for (HighsInt i = 0; i != numchgs; ++i) {
    double val = nodes[node].domchgstack[i].boundval;
    HighsInt col = nodes[node].domchgstack[i].column;
    switch (nodes[node].domchgstack[i].boundtype) {
      case HighsBoundType::kLower:
        nodes[node].domchglinks[i] =
            colLowerNodesPtr.get()[col].emplace(val, node).first;
        break;
      case HighsBoundType::kUpper:
        nodes[node].domchglinks[i] =
            colUpperNodesPtr.get()[col].emplace(val, node).first;
    }
  }
}